

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O0

ScopedFD __thiscall bssl::TemporaryFile::OpenFD(TemporaryFile *this,int flags)

{
  int fd;
  ulong uVar1;
  char *__file;
  int in_EDX;
  int flags_local;
  TemporaryFile *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    __file = (char *)std::__cxx11::string::c_str();
    fd = open(__file,in_EDX);
    ScopedFD::ScopedFD((ScopedFD *)this,fd);
  }
  else {
    memset(this,0,4);
    ScopedFD::ScopedFD((ScopedFD *)this);
  }
  return (ScopedFD)(int)this;
}

Assistant:

ScopedFD TemporaryFile::OpenFD(int flags) const {
  if (path_.empty()) {
    return ScopedFD();
  }
#if defined(OPENSSL_WINDOWS)
  return ScopedFD(_open(path_.c_str(), flags));
#else
  return ScopedFD(open(path_.c_str(), flags));
#endif
}